

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_insn_t_conflict create_label(MIR_context_t ctx,int64_t label_num)

{
  MIR_op_t *__dest;
  MIR_op_t local_58;
  MIR_insn_t_conflict local_20;
  MIR_insn_t_conflict insn;
  int64_t label_num_local;
  MIR_context_t ctx_local;
  
  insn = (MIR_insn_t_conflict)label_num;
  label_num_local = (int64_t)ctx;
  local_20 = new_insn1(ctx,MIR_LABEL);
  __dest = local_20->ops;
  MIR_new_int_op(&local_58,(MIR_context_t)label_num_local,(int64_t)insn);
  memcpy(__dest,&local_58,0x30);
  *(ulong *)&local_20->field_0x18 = *(ulong *)&local_20->field_0x18 & 0xffffffff;
  return local_20;
}

Assistant:

static MIR_insn_t create_label (MIR_context_t ctx, int64_t label_num) {
  MIR_insn_t insn = new_insn1 (ctx, MIR_LABEL);

  insn->ops[0] = MIR_new_int_op (ctx, label_num);
  insn->nops = 0;
  return insn;
}